

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline.h
# Opt level: O1

Edge * __thiscall
S2Polyline::Shape::chain_edge(Edge *__return_storage_ptr__,Shape *this,int i,int j)

{
  VType VVar1;
  S2Point *pSVar2;
  S2Point *pSVar3;
  S2LogMessage local_30;
  
  if (i == 0) {
    pSVar2 = vertex(this->polyline_,j);
    pSVar3 = vertex(this->polyline_,j + 1);
    VVar1 = pSVar2->c_[1];
    (__return_storage_ptr__->v0).c_[0] = pSVar2->c_[0];
    (__return_storage_ptr__->v0).c_[1] = VVar1;
    (__return_storage_ptr__->v0).c_[2] = pSVar2->c_[2];
    VVar1 = pSVar3->c_[1];
    (__return_storage_ptr__->v1).c_[0] = pSVar3->c_[0];
    (__return_storage_ptr__->v1).c_[1] = VVar1;
    (__return_storage_ptr__->v1).c_[2] = pSVar3->c_[2];
    return __return_storage_ptr__;
  }
  S2LogMessage::S2LogMessage
            (&local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polyline.h"
             ,0x13f,kFatal,(ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_30.stream_,"Check failed: (i) == (0) ",0x19);
  abort();
}

Assistant:

Edge chain_edge(int i, int j) const final {
      S2_DCHECK_EQ(i, 0);
      return Edge(polyline_->vertex(j), polyline_->vertex(j + 1));
    }